

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isubd-terrain.cpp
# Opt level: O1

bool loadBuffers(void)

{
  bool bVar1;
  
  bVar1 = loadTransformBuffer();
  if (bVar1) {
    bVar1 = loadGeometryBuffers();
  }
  if (bVar1 != false) {
    bVar1 = loadInstancedGeometryBuffers();
  }
  if (bVar1 != false) {
    bVar1 = loadSubdivisionBuffers();
    return bVar1;
  }
  return false;
}

Assistant:

bool loadBuffers()
{
    bool v = true;

    if (v) v &= loadTransformBuffer();
    if (v) v &= loadGeometryBuffers();
    if (v) v &= loadInstancedGeometryBuffers();
    if (v) v &= loadSubdivisionBuffers();

    return v;
}